

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmconsol.cpp
# Opt level: O0

int __thiscall CVmConsole::close_command_log(CVmConsole *this)

{
  undefined8 uVar1;
  void *pvVar2;
  undefined8 *puVar3;
  long *plVar4;
  int in_ESI;
  long in_RDI;
  err_frame_t err_cur__;
  uint local_e8 [2];
  undefined8 local_e0;
  void *local_d8;
  __jmp_buf_tag _Stack_d0;
  
  if (*(long *)(in_RDI + 0x28) != 0) {
    if (*(long **)(in_RDI + 0x28) != (long *)0x0) {
      (**(code **)(**(long **)(in_RDI + 0x28) + 8))();
    }
    puVar3 = (undefined8 *)_ZTW11G_err_frame();
    local_e0 = *puVar3;
    plVar4 = (long *)_ZTW11G_err_frame();
    *plVar4 = (long)local_e8;
    local_e8[0] = _setjmp(&_Stack_d0);
    if (local_e8[0] == 0) {
      CVmNetFile::close(*(CVmNetFile **)(in_RDI + 0x30),in_ESI);
    }
    uVar1 = local_e0;
    if (local_e8[0] == 1) {
      local_e8[0] = 2;
    }
    puVar3 = (undefined8 *)_ZTW11G_err_frame();
    *puVar3 = uVar1;
    if ((local_e8[0] & 0x4001) != 0) {
      puVar3 = (undefined8 *)_ZTW11G_err_frame();
      if ((*(uint *)*puVar3 & 2) != 0) {
        plVar4 = (long *)_ZTW11G_err_frame();
        free(*(void **)(*plVar4 + 0x10));
      }
      pvVar2 = local_d8;
      plVar4 = (long *)_ZTW11G_err_frame();
      *(void **)(*plVar4 + 0x10) = pvVar2;
      err_rethrow();
    }
    if ((local_e8[0] & 2) != 0) {
      free(local_d8);
    }
    *(undefined8 *)(in_RDI + 0x28) = 0;
  }
  if (*(long *)(in_RDI + 0x38) != 0) {
    vm_val_t::set_nil(*(vm_val_t **)(in_RDI + 0x38));
  }
  return 0;
}

Assistant:

int CVmConsole::close_command_log(VMG0_)
{
    /* if there's a command log file, close it */
    if (command_fp_ != 0)
    {
        /* close the file */
        delete command_fp_;

        /* close the network file */
        err_try
        {
            command_nf_->close(vmg0_);
        }
        err_catch_disc
        {
            /* 
             *   ignore any errors - our interface doesn't give us any
             *   meaningful way to return error information
             */
        }
        err_end;

        /* forget the file */
        command_fp_ = 0;
    }